

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# noise_util.c
# Opt level: O0

void aom_noise_tx_filter(aom_noise_tx_t *noise_tx,float *psd)

{
  int iVar1;
  int iVar2;
  float *pfVar3;
  float fVar4;
  float local_54;
  float local_4c;
  float local_44;
  float local_40;
  float p;
  float c1;
  float c0;
  float *c;
  int i;
  int x;
  int y;
  float kEps;
  float kBeta;
  int block_size;
  float *psd_local;
  aom_noise_tx_t *noise_tx_local;
  
  iVar1 = noise_tx->block_size;
  for (y = 0; y < iVar1; y = y + 1) {
    for (x = 0; x < iVar1; x = x + 1) {
      iVar2 = y * iVar1 + x;
      pfVar3 = noise_tx->tx_block + iVar2 * 2;
      if (ABS(*pfVar3) <= 1e-08) {
        local_40 = 1e-08;
      }
      else {
        local_40 = ABS(*pfVar3);
      }
      if (ABS(pfVar3[1]) <= 1e-08) {
        local_44 = 1e-08;
      }
      else {
        local_44 = ABS(pfVar3[1]);
      }
      local_54 = local_40 * local_40 + local_44 * local_44;
      if ((local_54 <= psd[iVar2] * 1.1) || (local_54 <= 1e-06)) {
        noise_tx->tx_block[iVar2 * 2] = noise_tx->tx_block[iVar2 * 2] * 0.09090911;
        iVar2 = iVar2 * 2 + 1;
        noise_tx->tx_block[iVar2] = noise_tx->tx_block[iVar2] * 0.09090911;
      }
      else {
        local_4c = local_54;
        if (local_54 <= 1e-06) {
          local_4c = 1e-06;
        }
        noise_tx->tx_block[iVar2 * 2] =
             ((local_54 - psd[iVar2]) / local_4c) * noise_tx->tx_block[iVar2 * 2];
        fVar4 = local_54 - psd[iVar2];
        if (local_54 <= 1e-06) {
          local_54 = 1e-06;
        }
        iVar2 = iVar2 * 2 + 1;
        noise_tx->tx_block[iVar2] = (fVar4 / local_54) * noise_tx->tx_block[iVar2];
      }
    }
  }
  return;
}

Assistant:

void aom_noise_tx_filter(struct aom_noise_tx_t *noise_tx, const float *psd) {
  const int block_size = noise_tx->block_size;
  const float kBeta = 1.1f;
  const float kEps = 1e-6f;
  for (int y = 0; y < block_size; ++y) {
    for (int x = 0; x < block_size; ++x) {
      int i = y * block_size + x;
      float *c = noise_tx->tx_block + 2 * i;
      const float c0 = AOMMAX((float)fabs(c[0]), 1e-8f);
      const float c1 = AOMMAX((float)fabs(c[1]), 1e-8f);
      const float p = c0 * c0 + c1 * c1;
      if (p > kBeta * psd[i] && p > 1e-6) {
        noise_tx->tx_block[2 * i + 0] *= (p - psd[i]) / AOMMAX(p, kEps);
        noise_tx->tx_block[2 * i + 1] *= (p - psd[i]) / AOMMAX(p, kEps);
      } else {
        noise_tx->tx_block[2 * i + 0] *= (kBeta - 1.0f) / kBeta;
        noise_tx->tx_block[2 * i + 1] *= (kBeta - 1.0f) / kBeta;
      }
    }
  }
}